

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O0

void __thiscall
Js::StackScriptFunction::BoxState::
ForEachStackNestedFunction<Js::StackScriptFunction::BoxState::Box()::__2>
          (BoxState *this,JavascriptStackWalker *walker,FunctionBody *callerFunctionBody,
          anon_class_8_1_8991fb9c fn)

{
  bool bVar1;
  InterpreterStackFrame *interpreterFrame_00;
  InterpreterStackFrame *interpreterFrame;
  FunctionBody *callerFunctionBody_local;
  JavascriptStackWalker *walker_local;
  BoxState *this_local;
  anon_class_8_1_8991fb9c fn_local;
  
  bVar1 = ParseableFunctionInfo::DoStackNestedFunc(&callerFunctionBody->super_ParseableFunctionInfo)
  ;
  if (bVar1) {
    interpreterFrame_00 = JavascriptStackWalker::GetCurrentInterpreterFrame(walker);
    if (interpreterFrame_00 == (InterpreterStackFrame *)0x0) {
      ForEachStackNestedFunctionNative<Js::StackScriptFunction::BoxState::Box()::__2>
                (this,walker,callerFunctionBody,fn);
    }
    else {
      ForEachStackNestedFunctionInterpreted<Js::StackScriptFunction::BoxState::Box()::__2>
                (this,interpreterFrame_00,callerFunctionBody,fn);
    }
  }
  return;
}

Assistant:

void StackScriptFunction::BoxState::ForEachStackNestedFunction(
        JavascriptStackWalker const& walker,
        FunctionBody *callerFunctionBody,
        Fn fn)
    {
        if (!callerFunctionBody->DoStackNestedFunc())
        {
            return;
        }
        InterpreterStackFrame *interpreterFrame = walker.GetCurrentInterpreterFrame();
        if (interpreterFrame)
        {
            this->ForEachStackNestedFunctionInterpreted(interpreterFrame, callerFunctionBody, fn);
        }
        else
        {
            this->ForEachStackNestedFunctionNative(walker, callerFunctionBody, fn);
        }
    }